

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall
IRBuilder::BuildReg2B1
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot srcRegSlot,
          byte index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  RegOpnd *baseOpnd;
  IndirOpnd *dstOpnd;
  Instr *instr;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x9f7,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004d374d;
    *puVar3 = 0;
  }
  if (newOpcode != SetConcatStrMultiItem) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x9f8,"(newOpcode == Js::OpCode::SetConcatStrMultiItem)",
                       "newOpcode == Js::OpCode::SetConcatStrMultiItem");
    if (!bVar2) {
LAB_004d374d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pRVar4 = BuildSrcOpnd(this,srcRegSlot,TyVar);
  baseOpnd = BuildDstOpnd(this,dstRegSlot,TyVar,false,true);
  dstOpnd = IR::IndirOpnd::New(baseOpnd,(uint)index,TyVar,this->m_func,false);
  IR::Opnd::SetValueType(&baseOpnd->super_Opnd,(ValueType)0x800);
  pRVar4 = InsertConvPrimStr(this,pRVar4,offset,true);
  instr = IR::Instr::New(SetConcatStrMultiItem,&dstOpnd->super_Opnd,&pRVar4->super_Opnd,this->m_func
                        );
  AddInstr(this,instr,0xffffffff);
  return;
}

Assistant:

void
IRBuilder::BuildReg2B1(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot, byte index)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    Assert(newOpcode == Js::OpCode::SetConcatStrMultiItem);

    IR::Instr *     instr;
    IR::RegOpnd * srcOpnd = this->BuildSrcOpnd(srcRegSlot);
    IR::RegOpnd * dstOpnd = this->BuildDstOpnd(dstRegSlot, TyVar, false, true);

    IR::IndirOpnd * indir1Opnd = IR::IndirOpnd::New(dstOpnd, index, TyVar, m_func);

    dstOpnd->SetValueType(ValueType::String);

    instr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem, indir1Opnd, InsertConvPrimStr(srcOpnd, offset, true), m_func);
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
}